

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tracks::Write(Tracks *this,IMkvWriter *writer)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  Track *pTVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long *in_RSI;
  Tracks *in_RDI;
  int64_t stop_position;
  Track *track_1;
  int32_t i_1;
  int64_t payload_position;
  Track *track;
  int32_t i;
  int32_t count;
  uint64_t size;
  uint64 in_stack_ffffffffffffffb0;
  IMkvWriter *in_stack_ffffffffffffffb8;
  uint32_t local_3c;
  uint32_t local_28;
  long local_20;
  bool local_1;
  
  local_20 = 0;
  uVar2 = track_entries_size(in_RDI);
  for (local_28 = 0; (int)local_28 < (int)uVar2; local_28 = local_28 + 1) {
    pTVar5 = GetTrackByIndex(in_RDI,local_28);
    if (pTVar5 == (Track *)0x0) {
      return false;
    }
    iVar3 = (*pTVar5->_vptr_Track[4])();
    local_20 = CONCAT44(extraout_var,iVar3) + local_20;
  }
  bVar1 = WriteEbmlMasterElement(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(uint64)in_RDI)
  ;
  if (bVar1) {
    lVar6 = (**(code **)(*in_RSI + 8))();
    if (lVar6 < 0) {
      local_1 = false;
    }
    else {
      for (local_3c = 0; (int)local_3c < (int)uVar2; local_3c = local_3c + 1) {
        pTVar5 = GetTrackByIndex(in_RDI,local_3c);
        uVar4 = (*pTVar5->_vptr_Track[5])(pTVar5,in_RSI);
        if ((uVar4 & 1) == 0) {
          return false;
        }
      }
      lVar7 = (**(code **)(*in_RSI + 8))();
      if ((lVar7 < 0) || (lVar7 - lVar6 != local_20)) {
        local_1 = false;
      }
      else {
        in_RDI->wrote_tracks_ = true;
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tracks::Write(IMkvWriter* writer) const {
  uint64_t size = 0;
  const int32_t count = track_entries_size();
  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);

    if (!track)
      return false;

    size += track->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTracks, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);
    if (!track->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  wrote_tracks_ = true;
  return true;
}